

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void strdump(char *e,char *p,wchar_t ewidth,wchar_t utf8)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  byte *pbVar6;
  uint uVar7;
  char *fmt;
  uint uVar8;
  char *pcVar9;
  long lStack_50;
  
  logprintf("      %*s = ",(ulong)(uint)ewidth,e);
  if (p == (char *)0x0) {
    pcVar9 = "NULL\n";
  }
  else {
    logprintf("\"");
    pcVar9 = p;
    while (cVar1 = *pcVar9, cVar1 != '\0') {
      pcVar9 = pcVar9 + 1;
      switch(cVar1) {
      case '\a':
        putchar(7);
        break;
      case '\b':
        putchar(8);
        break;
      default:
        if ((byte)(cVar1 - 0x20U) < 0x5f) {
          fmt = "%c";
        }
        else {
          fmt = "\\x%02X";
        }
        logprintf(fmt);
        break;
      case '\n':
        putchar(10);
        break;
      case '\r':
        putchar(0xd);
      }
    }
    logprintf("\"");
    sVar5 = strlen(p);
    logprintf(" (length %d)",sVar5 & 0xffffffff);
    pcVar9 = "\n";
    if (utf8 != L'\0') {
      sVar5 = strlen(p);
      logprintf(" [");
      uVar7 = 0;
      pbVar6 = (byte *)p;
      for (; sVar5 != 0; sVar5 = sVar5 - lStack_50) {
        bVar2 = *pbVar6;
        if (bVar2 == 0) break;
        bVar3 = _utf8_to_unicode_utf8_count[bVar2];
        if ((sVar5 < (ulong)(long)(char)bVar3) || (3 < bVar3 - 1)) {
LAB_00103efc:
          logprintf("]");
          logprintf(" (count %d",(ulong)uVar7);
          logprintf(",unknown %d bytes",sVar5);
          goto LAB_00103f4b;
        }
        switch((uint)bVar3) {
        case 1:
          uVar4 = bVar2 & 0x7f;
          lStack_50 = 1;
          break;
        case 2:
          if ((pbVar6[1] & 0xffffffc0) != 0x80) goto LAB_00103efc;
          uVar4 = pbVar6[1] & 0x3f | (bVar2 & 0x1f) << 6;
          lStack_50 = 2;
          break;
        case 3:
          if (((((int)(char)pbVar6[1] & 0xc0U) != 0x80) || ((pbVar6[2] & 0xffffffc0) != 0x80)) ||
             (uVar4 = ((int)(char)pbVar6[1] & 0x3fU) << 6 | (bVar2 & 0xf) << 0xc, uVar4 < 0x800))
          goto LAB_00103efc;
          uVar4 = pbVar6[2] & 0x3f | uVar4;
          lStack_50 = 3;
          break;
        case 4:
          if ((((3 < sVar5) && (((int)(char)pbVar6[1] & 0xc0U) == 0x80)) &&
              (((int)(char)pbVar6[2] & 0xc0U) == 0x80)) && ((pbVar6[3] & 0xffffffc0) == 0x80)) {
            uVar8 = (bVar2 & 7) * 0x40000;
            uVar4 = ((int)(char)pbVar6[1] & 0x3fU) * 0x1000;
            if (0xffefffff < (uVar4 + uVar8) - 0x110000) {
              uVar4 = pbVar6[3] & 0x3f | ((int)(char)pbVar6[2] & 0x3fU) << 6 | uVar4 | uVar8;
              lStack_50 = 4;
              break;
            }
          }
          goto LAB_00103efc;
        }
        if (pbVar6 != (byte *)p) {
          logprintf(" ");
        }
        logprintf("%04X",(ulong)uVar4);
        pbVar6 = pbVar6 + lStack_50;
        uVar7 = uVar7 + 1;
      }
      logprintf("]");
      logprintf(" (count %d",(ulong)uVar7);
LAB_00103f4b:
      logprintf(")");
      pcVar9 = "\n";
    }
  }
  logprintf(pcVar9);
  return;
}

Assistant:

static void strdump(const char *e, const char *p, int ewidth, int utf8)
{
	const char *q = p;

	logprintf("      %*s = ", ewidth, e);
	if (p == NULL) {
		logprintf("NULL\n");
		return;
	}
	logprintf("\"");
	while (*p != '\0') {
		unsigned int c = 0xff & *p++;
		switch (c) {
		case '\a': printf("\a"); break;
		case '\b': printf("\b"); break;
		case '\n': printf("\n"); break;
		case '\r': printf("\r"); break;
		default:
			if (c >= 32 && c < 127)
				logprintf("%c", c);
			else
				logprintf("\\x%02X", c);
		}
	}
	logprintf("\"");
	logprintf(" (length %d)", q == NULL ? -1 : (int)strlen(q));

	/*
	 * If the current string is UTF-8, dump its code points.
	 */
	if (utf8) {
		size_t len;
		uint32_t uc;
		int n;
		int cnt = 0;

		p = q;
		len = strlen(p);
		logprintf(" [");
		while ((n = _utf8_to_unicode(&uc, p, len)) > 0) {
			if (p != q)
				logprintf(" ");
			logprintf("%04X", uc);
			p += n;
			len -= n;
			cnt++;
		}
		logprintf("]");
		logprintf(" (count %d", cnt);
		if (n < 0) {
			logprintf(",unknown %d bytes", len);
		}
		logprintf(")");

	}
	logprintf("\n");
}